

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

void hurtmarmor(monst *mdef,int attk)

{
  char cVar1;
  int iVar2;
  obj *poVar3;
  char *pcVar4;
  obj *target;
  int hurt;
  int attk_local;
  monst *mdef_local;
  
  if (attk == 0x18) {
    target._0_4_ = 1;
  }
  else if (attk == 0x2a) {
    target._0_4_ = 3;
  }
  else {
    target._0_4_ = 2;
  }
LAB_00319401:
  do {
    iVar2 = rn2(5);
    switch(iVar2) {
    case 0:
      poVar3 = which_armor(mdef,4);
      if (poVar3 == (obj *)0x0) goto LAB_00319401;
      pcVar4 = xname(poVar3);
      cVar1 = rust_dmg(poVar3,pcVar4,(int)target,'\0',mdef);
      break;
    case 1:
      poVar3 = which_armor(mdef,2);
      if (poVar3 != (obj *)0x0) {
        pcVar4 = xname(poVar3);
        rust_dmg(poVar3,pcVar4,(int)target,'\x01',mdef);
        return;
      }
      poVar3 = which_armor(mdef,1);
      if (poVar3 != (obj *)0x0) {
        pcVar4 = xname(poVar3);
        rust_dmg(poVar3,pcVar4,(int)target,'\x01',mdef);
        return;
      }
      poVar3 = which_armor(mdef,0x40);
      if (poVar3 == (obj *)0x0) {
        return;
      }
      pcVar4 = xname(poVar3);
      rust_dmg(poVar3,pcVar4,(int)target,'\x01',mdef);
      return;
    case 2:
      poVar3 = which_armor(mdef,8);
      if (poVar3 == (obj *)0x0) goto LAB_00319401;
      pcVar4 = xname(poVar3);
      cVar1 = rust_dmg(poVar3,pcVar4,(int)target,'\0',mdef);
      break;
    case 3:
      poVar3 = which_armor(mdef,0x10);
      if (poVar3 == (obj *)0x0) goto LAB_00319401;
      pcVar4 = xname(poVar3);
      cVar1 = rust_dmg(poVar3,pcVar4,(int)target,'\0',mdef);
      break;
    case 4:
      poVar3 = which_armor(mdef,0x20);
      if (poVar3 == (obj *)0x0) goto LAB_00319401;
      pcVar4 = xname(poVar3);
      cVar1 = rust_dmg(poVar3,pcVar4,(int)target,'\0',mdef);
      break;
    default:
      goto LAB_0031962d;
    }
    if (cVar1 != '\0') {
LAB_0031962d:
      return;
    }
  } while( true );
}

Assistant:

void hurtmarmor(struct monst *mdef, int attk)
{
	int	hurt;
	struct obj *target;

	switch(attk) {
	    /* 0 is burning, which we should never be called with */
	    case AD_RUST: hurt = 1; break;
	    case AD_CORR: hurt = 3; break;
	    default: hurt = 2; break;
	}
	/* What the following code does: it keeps looping until it
	 * finds a target for the rust monster.
	 * Head, feet, etc... not covered by metal, or covered by
	 * rusty metal, are not targets.  However, your body always
	 * is, no matter what covers it.
	 */
	while (1) {
	    switch(rn2(5)) {
	    case 0:
		target = which_armor(mdef, W_ARMH);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 1:
		target = which_armor(mdef, W_ARMC);
		if (target) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		    break;
		}
		if ((target = which_armor(mdef, W_ARM)) != NULL) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		} else if ((target = which_armor(mdef, W_ARMU)) != NULL) {
		    rust_dmg(target, xname(target), hurt, TRUE, mdef);
		}
		break;
	    case 2:
		target = which_armor(mdef, W_ARMS);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 3:
		target = which_armor(mdef, W_ARMG);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    case 4:
		target = which_armor(mdef, W_ARMF);
		if (!target || !rust_dmg(target, xname(target), hurt, FALSE, mdef))
		    continue;
		break;
	    }
	    break; /* Out of while loop */
	}
}